

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_description_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  unsigned_long __val;
  unsigned_long __val_00;
  string *this_00;
  string desc;
  string sStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = &sStack_128;
  ::std::__cxx11::string::string((string *)&local_c8,&app->description_);
  __val = app->require_option_min_;
  __val_00 = app->require_option_max_;
  if (app->required_ == true) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"REQUIRED",(allocator<char> *)&local_a8);
    FormatterBase::get_label(&sStack_128,&this->super_FormatterBase,&local_48);
    ::std::operator+(&local_108," ",&sStack_128);
    ::std::operator+(&local_e8,&local_108," ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_c8,&local_e8);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::~string((string *)&sStack_128);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  if (__val == 0 || __val_00 != __val) {
    if (__val_00 == 0) {
      if (__val == 0) goto LAB_0016ec37;
      std::__cxx11::to_string(&sStack_128,__val);
      ::std::operator+(&local_108," \n[At least ",&sStack_128);
      ::std::operator+(&local_e8,&local_108," of the following options are required]");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_c8,&local_e8);
      goto LAB_0016ec1b;
    }
    if (__val == 0) {
      std::__cxx11::to_string(&sStack_128,__val_00);
      ::std::operator+(&local_108," \n[At most ",&sStack_128);
      ::std::operator+(&local_e8,&local_108," of the following options are allowed]");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_c8,&local_e8);
      goto LAB_0016ec1b;
    }
    std::__cxx11::to_string(&local_68,__val);
    ::std::operator+(&local_a8," \n[Between ",&local_68);
    ::std::operator+(&sStack_128,&local_a8," and ");
    std::__cxx11::to_string(&local_88,__val_00);
    ::std::operator+(&local_108,&sStack_128,&local_88);
    ::std::operator+(&local_e8,&local_108," of the follow options are required]");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_c8,&local_e8);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&sStack_128);
    ::std::__cxx11::string::~string((string *)&local_a8);
    this_00 = &local_68;
  }
  else {
    if (__val == 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_c8," \n[Exactly 1 of the following options is required]");
      goto LAB_0016ec37;
    }
    std::__cxx11::to_string(&sStack_128,__val);
    ::std::operator+(&local_108," \n[Exactly ",&sStack_128);
    ::std::operator+(&local_e8,&local_108," options from the following list are required]");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_c8,&local_e8);
LAB_0016ec1b:
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_108);
  }
  ::std::__cxx11::string::~string((string *)this_00);
LAB_0016ec37:
  if (local_c8._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ::std::operator+(__return_storage_ptr__,&local_c8,"\n");
  }
  ::std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();
    if(app->get_required()) {
        desc += " " + get_label("REQUIRED") + " ";
    }
    if((max_options == min_options) && (min_options > 0)) {
        if(min_options == 1) {
            desc += " \n[Exactly 1 of the following options is required]";
        } else {
            desc += " \n[Exactly " + std::to_string(min_options) + " options from the following list are required]";
        }
    } else if(max_options > 0) {
        if(min_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the follow options are required]";
        } else {
            desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
        }
    } else if(min_options > 0) {
        desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
    }
    return (!desc.empty()) ? desc + "\n" : std::string{};
}